

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive.cpp
# Opt level: O0

optional<pbrt::ShapeIntersection> * __thiscall
pbrt::PrimitiveHandle::Intersect(PrimitiveHandle *this,Ray *r,Float tMax)

{
  optional<pbrt::ShapeIntersection> *in_RDI;
  anon_class_16_2_d707c455 in_stack_00000000;
  anon_class_16_2_d707c455 isect;
  
  TaggedPointer<pbrt::SimplePrimitive,pbrt::GeometricPrimitive,pbrt::TransformedPrimitive,pbrt::AnimatedPrimitive,pbrt::BVHAggregate,pbrt::KdTreeAggregate>
  ::DispatchCPU<pbrt::PrimitiveHandle::Intersect(pbrt::Ray_const&,float)const::__0>
            ((TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
              *)in_RDI,in_stack_00000000);
  return in_RDI;
}

Assistant:

pstd::optional<ShapeIntersection> PrimitiveHandle::Intersect(const Ray &r,
                                                             Float tMax) const {
    auto isect = [&](auto ptr) { return ptr->Intersect(r, tMax); };
    return DispatchCPU(isect);
}